

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::AnyTypeInfo::Deserialize(AnyTypeInfo *this,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  int iVar4;
  AnyTypeInfo *pAVar5;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar7;
  shared_ptr<duckdb::AnyTypeInfo,_true> local_48;
  LogicalType local_38;
  idx_t iVar6;
  
  pAVar5 = (AnyTypeInfo *)operator_new(0x58);
  AnyTypeInfo(pAVar5);
  local_48.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pAVar5;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::AnyTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pAVar5);
  pAVar5 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&local_48);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"target_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_38,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (pAVar5->target_type).id_ = local_38.id_;
  (pAVar5->target_type).physical_type_ = local_38.physical_type_;
  peVar1 = (pAVar5->target_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (pAVar5->target_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pAVar5->target_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pAVar5->target_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_38);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pAVar5 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&local_48);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"cast_score");
  if ((char)uVar3 == '\0') {
    iVar6 = 0;
  }
  else {
    iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar6 = CONCAT44(extraout_var,iVar4);
  }
  pAVar5->cast_score = iVar6;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_48.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_48.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar7.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> AnyTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<AnyTypeInfo>(new AnyTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "cast_score", result->cast_score);
	return std::move(result);
}